

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMullMusashi<(moira::Core)2,(moira::Instr)156,(moira::Mode)2,4>
          (Moira *this,u16 opcode)

{
  uint op2;
  u32 uVar1;
  ulong in_RAX;
  u64 uVar2;
  ulong uVar3;
  u32 data;
  u32 ea;
  undefined8 local_38;
  
  local_38 = in_RAX;
  uVar1 = readI<(moira::Core)2,2>(this);
  uVar3 = (ulong)(uVar1 >> 0xc & 7);
  readOp<(moira::Core)2,(moira::Mode)2,4,0ull>
            (this,opcode & 7,(u32 *)((long)&local_38 + 4),(u32 *)&local_38);
  prefetch<(moira::Core)2,4ull>(this);
  op2 = *(uint *)((long)&(this->reg).field_3 + uVar3 * 4);
  switch(uVar1 >> 10 & 3) {
  case 0:
    uVar2 = mullu<(moira::Core)2,2>(this,(u32)local_38,op2);
    goto LAB_002e6191;
  case 1:
    uVar2 = (ulong)op2 * (local_38 & 0xffffffff);
    (this->reg).sr.n = SUB81(uVar2 >> 0x3f,0);
    (this->reg).sr.z = uVar2 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    break;
  case 2:
    uVar2 = mulls<(moira::Core)2,2>(this,(u32)local_38,op2);
    goto LAB_002e6191;
  case 3:
    uVar2 = mulls<(moira::Core)2,4>(this,(u32)local_38,op2);
  }
  *(int *)((long)&(this->reg).field_3 + (ulong)(uVar1 & 7) * 4) = (int)(uVar2 >> 0x20);
LAB_002e6191:
  *(int *)((long)&(this->reg).field_3 + uVar3 * 4) = (int)uVar2;
  return;
}

Assistant:

void
Moira::execMullMusashi(u16 opcode)
{
    u64 result;
    u32 ea, data;
    u16 ext = (u16)readI<C, Word>();

    int src = _____________xxx(opcode);
    int dh  = _____________xxx(ext);
    int dl  = _xxx____________(ext);

    readOp<C, M, S>(src, &ea, &data);

    prefetch<C, POLL>();

    switch (____xx__________(ext)) {

        case 0b00:

            result = mullu<C, Word>(data, readD(dl));
            writeD(dl, u32(result));
            break;

        case 0b01:

            result = mullu<C, Long>(data, readD(dl));
            writeD(dh, u32(result >> 32));
            writeD(dl, u32(result));
            break;

        case 0b10:

            result = mulls<C, Word>(data, readD(dl));
            writeD(dl, u32(result));
            break;

        case 0b11:

            result = mulls<C, Long>(data, readD(dl));
            writeD(dh, u32(result >> 32));
            writeD(dl, u32(result));
            break;
    }
}